

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

void __thiscall
Memory::HeapBlockMap32::Cleanup(HeapBlockMap32 *this,bool concurrentFindImplicitRoot)

{
  L2MapChunk *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  HeapAllocator *allocator;
  undefined7 in_register_00000031;
  long lVar5;
  
  lVar5 = 1;
  puVar4 = (undefined4 *)
           __tls_get_addr(&PTR_013e5f18,CONCAT71(in_register_00000031,concurrentFindImplicitRoot));
  do {
    if (lVar5 == 0x1001) {
      return;
    }
    this_00 = this->map[lVar5 + -1];
    if (this_00 != (L2MapChunk *)0x0) {
      bVar2 = L2MapChunk::IsEmpty(this_00);
      if (bVar2) {
        this->map[lVar5 + -1] = (L2MapChunk *)0x0;
        allocator = HeapAllocator::GetNoMemProtectInstance();
        DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::HeapBlockMap32::L2MapChunk>
                  (allocator,this_00);
        uVar3 = this->count;
        if (uVar3 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                             ,0x49b,"(count > 0)","count > 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
          uVar3 = this->count;
        }
        this->count = uVar3 - 1;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void
HeapBlockMap32::Cleanup(bool concurrentFindImplicitRoot)
{
    for (uint id1 = 0; id1 < L1Count; id1++)
    {
        L2MapChunk * l2map = map[id1];
        if (l2map != nullptr && l2map->IsEmpty())
        {
            // Concurrent searches for implicit roots will never see empty L2 maps.
            map[id1] = nullptr;
            NoMemProtectHeapDelete(l2map);
            Assert(count > 0);
            count--;
        }
    }
}